

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
          (QMovableArrayOps<QCss::BasicSelector> *this,qsizetype i,BasicSelector *args)

{
  qsizetype *pqVar1;
  BasicSelector **ppBVar2;
  BasicSelector *pBVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  BasicSelector *pBVar9;
  Data *pDVar10;
  Data *pDVar11;
  Data *pDVar12;
  long in_FS_OFFSET;
  bool bVar13;
  BasicSelector tmp;
  QArrayDataPointer<QString> QStack_90;
  QArrayDataPointer<QCss::Pseudo> local_78;
  QArrayDataPointer<QCss::AttributeSelector> QStack_60;
  Relation local_48;
  undefined4 uStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
           super_QArrayDataPointer<QCss::BasicSelector>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0038af48:
    pDVar6 = (args->elementName).d.d;
    pcVar7 = (args->elementName).d.ptr;
    qVar8 = (args->elementName).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QStack_90.d = (args->ids).d.d;
    QStack_90.ptr = (args->ids).d.ptr;
    QStack_90.size = (args->ids).d.size;
    if (QStack_90.d != (Data *)0x0) {
      LOCK();
      ((QStack_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.d = (args->pseudos).d.d;
    local_78.ptr = (args->pseudos).d.ptr;
    local_78.size = (args->pseudos).d.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QStack_60.d = (args->attributeSelectors).d.d;
    QStack_60.ptr = (args->attributeSelectors).d.ptr;
    QStack_60.size = (args->attributeSelectors).d.size;
    if (QStack_60.d != (Data *)0x0) {
      LOCK();
      ((QStack_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _local_48 = CONCAT44(0xaaaaaaaa,args->relationToNext);
    bVar13 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
             super_QArrayDataPointer<QCss::BasicSelector>.size != 0;
    QArrayDataPointer<QCss::BasicSelector>::detachAndGrow
              ((QArrayDataPointer<QCss::BasicSelector> *)this,(uint)(i == 0 && bVar13),1,
               (BasicSelector **)0x0,(QArrayDataPointer<QCss::BasicSelector> *)0x0);
    pBVar9 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
             super_QArrayDataPointer<QCss::BasicSelector>.ptr;
    if (i == 0 && bVar13) {
      pBVar9[-1].elementName.d.d = pDVar6;
      pBVar9[-1].elementName.d.ptr = pcVar7;
      pBVar9[-1].elementName.d.size = qVar8;
      pBVar9[-1].ids.d.d = QStack_90.d;
      pBVar9[-1].ids.d.ptr = QStack_90.ptr;
      pBVar9[-1].ids.d.size = QStack_90.size;
      pBVar9[-1].pseudos.d.d = local_78.d;
      pBVar9[-1].pseudos.d.ptr = local_78.ptr;
      pBVar9[-1].pseudos.d.size = local_78.size;
      pBVar9[-1].attributeSelectors.d.d = QStack_60.d;
      pBVar9[-1].attributeSelectors.d.ptr = QStack_60.ptr;
      pBVar9[-1].attributeSelectors.d.size = QStack_60.size;
      pBVar9[-1].relationToNext = local_48;
      (this->super_QGenericArrayOps<QCss::BasicSelector>).
      super_QArrayDataPointer<QCss::BasicSelector>.ptr = pBVar9 + -1;
    }
    else {
      pBVar3 = pBVar9 + i;
      memmove(pBVar3 + 1,pBVar9 + i,
              ((this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.size - i) * 0x68);
      (pBVar3->elementName).d.d = pDVar6;
      (pBVar3->elementName).d.ptr = pcVar7;
      (pBVar3->elementName).d.size = qVar8;
      (pBVar3->ids).d.d = QStack_90.d;
      (pBVar3->ids).d.ptr = QStack_90.ptr;
      (pBVar3->ids).d.size = QStack_90.size;
      (pBVar3->pseudos).d.d = local_78.d;
      (pBVar3->pseudos).d.ptr = local_78.ptr;
      (pBVar3->pseudos).d.size = local_78.size;
      (pBVar3->attributeSelectors).d.d = QStack_60.d;
      (pBVar3->attributeSelectors).d.ptr = QStack_60.ptr;
      (pBVar3->attributeSelectors).d.size = QStack_60.size;
      pBVar3->relationToNext = local_48;
    }
    QStack_60.size = 0;
    QStack_60.ptr = (AttributeSelector *)0x0;
    QStack_60.d = (Data *)0x0;
    local_78.size = 0;
    local_78.ptr = (Pseudo *)0x0;
    local_78.d = (Data *)0x0;
    QStack_90.size = 0;
    QStack_90.ptr = (QString *)0x0;
    QStack_90.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
              super_QArrayDataPointer<QCss::BasicSelector>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&QStack_60);
    QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_90);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
            super_QArrayDataPointer<QCss::BasicSelector>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::BasicSelector>).
                      super_QArrayDataPointer<QCss::BasicSelector>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x4ec4ec4ec4ec4ec5)) {
      pBVar9 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.ptr;
      pDVar6 = (args->elementName).d.d;
      pBVar9[lVar5].elementName.d.d = pDVar6;
      pBVar9[lVar5].elementName.d.ptr = (args->elementName).d.ptr;
      pBVar9[lVar5].elementName.d.size = (args->elementName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ids).d.d;
      pBVar9[lVar5].ids.d.d = pDVar10;
      pBVar9[lVar5].ids.d.ptr = (args->ids).d.ptr;
      pBVar9[lVar5].ids.d.size = (args->ids).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->pseudos).d.d;
      pBVar9[lVar5].pseudos.d.d = pDVar11;
      pBVar9[lVar5].pseudos.d.ptr = (args->pseudos).d.ptr;
      pBVar9[lVar5].pseudos.d.size = (args->pseudos).d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar12 = (args->attributeSelectors).d.d;
      pBVar9[lVar5].attributeSelectors.d.d = pDVar12;
      pBVar9[lVar5].attributeSelectors.d.ptr = (args->attributeSelectors).d.ptr;
      pBVar9[lVar5].attributeSelectors.d.size = (args->attributeSelectors).d.size;
      if (pDVar12 != (Data *)0x0) {
        LOCK();
        (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar9[lVar5].relationToNext = args->relationToNext;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((BasicSelector *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QCss::BasicSelector>).
          super_QArrayDataPointer<QCss::BasicSelector>.ptr)) goto LAB_0038af48;
      pBVar9 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.ptr;
      pDVar6 = (args->elementName).d.d;
      pBVar9[-1].elementName.d.d = pDVar6;
      pBVar9[-1].elementName.d.ptr = (args->elementName).d.ptr;
      pBVar9[-1].elementName.d.size = (args->elementName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ids).d.d;
      pBVar9[-1].ids.d.d = pDVar10;
      pBVar9[-1].ids.d.ptr = (args->ids).d.ptr;
      pBVar9[-1].ids.d.size = (args->ids).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->pseudos).d.d;
      pBVar9[-1].pseudos.d.d = pDVar11;
      pBVar9[-1].pseudos.d.ptr = (args->pseudos).d.ptr;
      pBVar9[-1].pseudos.d.size = (args->pseudos).d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar12 = (args->attributeSelectors).d.d;
      pBVar9[-1].attributeSelectors.d.d = pDVar12;
      pBVar9[-1].attributeSelectors.d.ptr = (args->attributeSelectors).d.ptr;
      pBVar9[-1].attributeSelectors.d.size = (args->attributeSelectors).d.size;
      if (pDVar12 != (Data *)0x0) {
        LOCK();
        (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar9[-1].relationToNext = args->relationToNext;
      ppBVar2 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
                 super_QArrayDataPointer<QCss::BasicSelector>.ptr;
      *ppBVar2 = *ppBVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
              super_QArrayDataPointer<QCss::BasicSelector>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }